

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_block.cpp
# Opt level: O1

BlockTxDataStruct *
cfd::js::api::BlockStructApi::GetTxDataFromBlock
          (BlockTxDataStruct *__return_storage_ptr__,BlockTxRequestStruct *request)

{
  _Rb_tree_header *p_Var1;
  string *in_R8;
  undefined1 local_158 [32];
  _Any_data local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [32];
  _Alloc_hider local_f8;
  undefined1 local_e8 [24];
  _Alloc_hider local_d0;
  char local_c0 [16];
  _Alloc_hider local_b0;
  char local_a0 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_60;
  
  (__return_storage_ptr__->tx)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->tx).field_2;
  (__return_storage_ptr__->tx)._M_string_length = 0;
  (__return_storage_ptr__->tx).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->txoutproof)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->txoutproof).field_2;
  (__return_storage_ptr__->txoutproof)._M_string_length = 0;
  (__return_storage_ptr__->txoutproof).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158._0_8_ = 0;
  local_158._8_8_ = (pointer)0x0;
  local_158._24_8_ =
       std::
       _Function_handler<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_block.cpp:63:7)>
       ::_M_invoke;
  local_158._16_8_ =
       std::
       _Function_handler<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_block.cpp:63:7)>
       ::_M_manager;
  local_138._M_unused._M_object = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"GetTxDataFromBlock","");
  ExecuteStructApi<cfd::js::api::BlockTxRequestStruct,cfd::js::api::BlockTxDataStruct>
            ((BlockTxDataStruct *)local_118,(api *)request,(BlockTxRequestStruct *)local_158,
             (function<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&)>
              *)&local_138,in_R8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_118);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->txoutproof,(string *)&local_f8)
  ;
  (__return_storage_ptr__->error).code = local_e8._16_4_;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).type,(string *)&local_d0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->error).message,(string *)&local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if (_Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &_Stack_90._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = _Stack_90._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_90._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &_Stack_60._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_60._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_90);
  if (local_b0._M_p != local_a0) {
    operator_delete(local_b0._M_p);
  }
  if (local_d0._M_p != local_c0) {
    operator_delete(local_d0._M_p);
  }
  if ((_Base_ptr)local_f8._M_p != (_Base_ptr)local_e8) {
    operator_delete(local_f8._M_p);
  }
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_);
  }
  if ((undefined1 *)local_138._M_unused._0_8_ != local_128) {
    operator_delete(local_138._M_unused._M_object);
  }
  if ((code *)local_158._16_8_ != (code *)0x0) {
    (*(code *)local_158._16_8_)(local_158,local_158,3);
  }
  return __return_storage_ptr__;
}

Assistant:

BlockTxDataStruct BlockStructApi::GetTxDataFromBlock(
    const BlockTxRequestStruct& request) {
  auto call_func =
      [](const BlockTxRequestStruct& request) -> BlockTxDataStruct {
    Block block(request.block);
    Txid txid(request.txid);
    auto tx = block.GetTransaction(txid);
    auto proof = block.GetTxOutProof(std::vector<Txid>{txid});

    BlockTxDataStruct result;
    result.tx = tx.GetHex();
    result.txoutproof = proof.GetHex();
    return result;
  };

  BlockTxDataStruct result;
  result = ExecuteStructApi<BlockTxRequestStruct, BlockTxDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}